

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModelExtractor_impl.hpp
# Opt level: O2

void __thiscall
hiberlite::ExtractModel::
act<hiberlite::AVisitor<hiberlite::ExtractModel>,std::__cxx11::string,hiberlite::stl_stream_adapter<std::__cxx11::string,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
          (ExtractModel *this,AVisitor<hiberlite::ExtractModel> *av,
          collection_nvp<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hiberlite::stl_stream_adapter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          *nvp)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *_value;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *entry;
  sql_nvp<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> el;
  allocator local_1da;
  allocator local_1d9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1d8;
  Scope local_1d0;
  string local_188;
  string local_168;
  string local_148;
  string local_128;
  string local_108;
  string local_e8;
  string local_c8;
  string local_a8;
  string local_88;
  sql_nvp<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_68
  ;
  
  access::construct<hiberlite::AVisitor<hiberlite::ExtractModel>,std::__cxx11::string>
            (av,&local_1d8);
  std::__cxx11::string::string((string *)&local_88,(string *)nvp);
  AVisitor<hiberlite::ExtractModel>::diveTable(av,&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  Scope::Scope(&local_1d0,&av->scope);
  std::__cxx11::string::string((string *)&local_a8,(string *)&local_1d0);
  std::__cxx11::string::string((string *)&local_c8,"hiberlite_parent_id",&local_1d9);
  std::__cxx11::string::string((string *)&local_e8,"INTEGER",&local_1da);
  putNamedColumn(this,&local_a8,&local_c8,&local_e8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_a8);
  Scope::~Scope(&local_1d0);
  Scope::Scope(&local_1d0,&av->scope);
  std::__cxx11::string::string((string *)&local_108,(string *)&local_1d0);
  std::__cxx11::string::string((string *)&local_128,"hiberlite_entry_indx",&local_1d9);
  std::__cxx11::string::string((string *)&local_148,"INTEGER",&local_1da);
  putNamedColumn(this,&local_108,&local_128,&local_148);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::~string((string *)&local_128);
  std::__cxx11::string::~string((string *)&local_108);
  Scope::~Scope(&local_1d0);
  std::__cxx11::string::string((string *)&local_168,"item",&local_1d9);
  _value = local_1d8;
  std::__cxx11::string::string((string *)&local_188,"",&local_1da);
  sql_nvp<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::sql_nvp
            ((sql_nvp<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_1d0,&local_168,_value,&local_188);
  std::__cxx11::string::~string((string *)&local_188);
  std::__cxx11::string::~string((string *)&local_168);
  sql_nvp<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::sql_nvp
            (&local_68,
             (sql_nvp<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_1d0);
  AVisitor<hiberlite::ExtractModel>::operator&(av,&local_68);
  sql_nvp<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~sql_nvp(&local_68);
  AVisitor<hiberlite::ExtractModel>::popScope(av);
  access::destroy<hiberlite::ExtractModel,std::__cxx11::string>(this,local_1d8);
  sql_nvp<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~sql_nvp((sql_nvp<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)&local_1d0);
  return;
}

Assistant:

void ExtractModel::act(AV& av, collection_nvp<E,S> nvp )
{
	E* entry;
	construct(av, &entry, static_cast<unsigned int>(0));
		av.diveTable(nvp.name);

			putNamedColumn(av.getScope().table(), HIBERLITE_PARENTID_COLUMN, HIBERLITE_ID_STORAGE_CLASS);
			putNamedColumn(av.getScope().table(), HIBERLITE_ENTRY_INDEX_COLUMN, HIBERLITE_ID_STORAGE_CLASS);

			sql_nvp<E> el("item",*entry);
			av & el;
		av.pop();
	destroy(*this, entry, static_cast<unsigned int>(0));
}